

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Task.h
# Opt level: O0

void __thiscall
TaskSpec::TaskSpec(TaskSpec *this,uint64_t id,string *conn_id,string *request_str,uint64_t epoch_ms,
                  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
                  *locks)

{
  string *in_RCX;
  string *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  *in_R8;
  string *this_00;
  string *this_01;
  
  *in_RDI = in_RSI;
  this_00 = (string *)(in_RDI + 1);
  this_01 = in_RCX;
  std::__cxx11::string::string(this_00,in_RDX);
  std::__cxx11::string::string((string *)(in_RDI + 5),in_RCX);
  in_RDI[9] = in_R8;
  std::atomic<unsigned_long>::atomic((atomic<unsigned_long> *)this_00,(__integral_type)in_RDX);
  std::atomic<unsigned_long>::atomic((atomic<unsigned_long> *)this_00,(__integral_type)in_RDX);
  std::
  vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
  ::vector((vector<std::variant<DatasetLock,_IteratorLock>,_std::allocator<std::variant<DatasetLock,_IteratorLock>_>_>
            *)this_01,in_R8);
  return;
}

Assistant:

TaskSpec(uint64_t id, std::string conn_id, std::string request_str,
             uint64_t epoch_ms, std::vector<DatabaseLock> locks)
        : id_(id),
          conn_id_(std::move(conn_id)),
          request_str_(std::move(request_str)),
          epoch_ms_(epoch_ms),
          work_estimated_(0),
          work_done_(0),
          locks_(locks) {}